

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

Terminal * term_init(Conf *myconf,unicode_data *ucsdata,TermWin *win)

{
  Terminal *term;
  Conf *pCVar1;
  char *pcVar2;
  BidiContext *pBVar3;
  
  term = (Terminal *)safemalloc(1,0x2200,0);
  term->win = win;
  term->ucsdata = ucsdata;
  pCVar1 = conf_copy(myconf);
  term->conf = pCVar1;
  term->logctx = (LogContext *)0x0;
  term->compatibility_level = L'\xffff';
  builtin_strncpy(term->id_string,"\x1b[?6c",6);
  term->tblink_pending = false;
  term->cblink_pending = false;
  term->paste_buffer = (wchar_t *)0x0;
  term->paste_len = L'\0';
  bufchain_init(&term->inbuf);
  bufchain_init(&term->printer_buf);
  term->printing = false;
  term->only_printing = false;
  term->print_job = (printer_job *)0x0;
  term->vt52_mode = false;
  term->repeat_off = false;
  term->cr_lf_return = false;
  term->seen_disp_event = false;
  term->mouse_is_down = L'\0';
  term->reset_132 = false;
  term->cblinker = false;
  term->tblinker = false;
  term->has_focus = true;
  term->termstate = LEXICOGRAPHIC;
  term->selstate = LEXICOGRAPHIC;
  term->curstype = L'\0';
  term_copy_stuff_from_conf(term);
  term->alt_sblines = L'\0';
  term->scrollback = (tree234 *)0x0;
  term->screen = (tree234 *)0x0;
  term->alt_screen = (tree234 *)0x0;
  term->disptop = L'\0';
  term->tempsblines = L'\0';
  term->disptext = (termline **)0x0;
  term->dispcursx = L'\xffffffff';
  term->dispcursy = L'\xffffffff';
  term->tabs = (uchar *)0x0;
  term->selstate = LEXICOGRAPHIC;
  (term->selstart).y = L'\0';
  (term->selstart).x = L'\0';
  (term->selend).y = L'\0';
  (term->selend).x = L'\0';
  term->rows = L'\xffffffff';
  term->cols = L'\xffffffff';
  power_on(term,true);
  term->lastbeep = 0;
  term->beephead = (beeptime *)0x0;
  term->beeptail = (beeptime *)0x0;
  *(undefined8 *)((long)&term->beeptail + 5) = 0;
  term->attr_mask = L'\xffffffff';
  term->backend = (Backend *)0x0;
  term->in_term_out = false;
  term->ltemp = (termchar *)0x0;
  term->ltemp_size = L'\0';
  term->window_update_pending = false;
  term->window_update_cooldown = false;
  term->wcFrom = (bidi_char *)0x0;
  term->wcTo = (bidi_char *)0x0;
  term->wcFromTo_size = L'\0';
  term->pre_bidi_cache = (bidi_cache_entry *)0x0;
  term->post_bidi_cache = (bidi_cache_entry *)0x0;
  term->bidi_cache_size = 0;
  (term->basic_erase_char).chr = 0xd820;
  (term->basic_erase_char).attr = 0x20500;
  (term->basic_erase_char).cc_next = L'\0';
  (term->basic_erase_char).truecolour.fg.enabled = false;
  (term->basic_erase_char).truecolour.fg.r = '\0';
  (term->basic_erase_char).truecolour.fg.g = '\0';
  (term->basic_erase_char).truecolour.fg.b = '\0';
  (term->basic_erase_char).truecolour.bg.enabled = false;
  (term->basic_erase_char).truecolour.bg.r = '\0';
  (term->basic_erase_char).truecolour.bg.g = '\0';
  (term->basic_erase_char).truecolour.bg.b = '\0';
  (term->erase_char).chr = (term->basic_erase_char).chr;
  (term->erase_char).attr = (term->basic_erase_char).attr;
  (term->erase_char).truecolour = (term->basic_erase_char).truecolour;
  (term->erase_char).cc_next = (term->basic_erase_char).cc_next;
  *(undefined4 *)&(term->erase_char).field_0x1c =
       *(undefined4 *)&(term->basic_erase_char).field_0x1c;
  term->last_selected_tc = (truecolour *)0x0;
  term->last_selected_len = 0;
  term->last_selected_text = (wchar_t *)0x0;
  term->last_selected_attr = (wchar_t *)0x0;
  term->mouse_select_clipboards[0] = L'\x01';
  term->n_mouse_select_clipboards = L'\x01';
  term->mouse_paste_clipboard = L'\0';
  term->last_graphic_char = 0;
  term->trusted = true;
  term->bracketed_paste_active = false;
  pcVar2 = dupstr("");
  term->window_title = pcVar2;
  pcVar2 = dupstr("");
  term->icon_title = pcVar2;
  term->wintitle_codepage = L'\xffff';
  term->icontitle_codepage = L'\xffff';
  term->minimised = false;
  term->win_resize_pending = LEXICOGRAPHIC;
  term->win_zorder_pending = false;
  term->win_minimise_pending = false;
  term->win_maximise_pending = false;
  term->win_title_pending = false;
  term->win_icon_title_pending = false;
  term->win_pointer_shape_pending = false;
  term->win_refresh_pending = false;
  term->win_scrollbar_update_pending = false;
  term->win_palette_pending = false;
  term->winpos_x = 0;
  term->winpos_y = 0;
  term->winpixsize_x = 0;
  term->winpixsize_y = 0;
  term->win_move_pending = false;
  pBVar3 = bidi_new_context();
  term->bidi_ctx = pBVar3;
  palette_reset(term,false);
  return term;
}

Assistant:

Terminal *term_init(Conf *myconf, struct unicode_data *ucsdata, TermWin *win)
{
    Terminal *term;

    /*
     * Allocate a new Terminal structure and initialise the fields
     * that need it.
     */
    term = snew(Terminal);
    term->win = win;
    term->ucsdata = ucsdata;
    term->conf = conf_copy(myconf);
    term->logctx = NULL;
    term->compatibility_level = TM_PUTTY;
    strcpy(term->id_string, "\033[?6c");
    term->cblink_pending = term->tblink_pending = false;
    term->paste_buffer = NULL;
    term->paste_len = 0;
    bufchain_init(&term->inbuf);
    bufchain_init(&term->printer_buf);
    term->printing = term->only_printing = false;
    term->print_job = NULL;
    term->vt52_mode = false;
    term->cr_lf_return = false;
    term->seen_disp_event = false;
    term->mouse_is_down = 0;
    term->reset_132 = false;
    term->cblinker = false;
    term->tblinker = false;
    term->has_focus = true;
    term->repeat_off = false;
    term->termstate = TOPLEVEL;
    term->selstate = NO_SELECTION;
    term->curstype = 0;

    term_copy_stuff_from_conf(term);

    term->screen = term->alt_screen = term->scrollback = NULL;
    term->tempsblines = 0;
    term->alt_sblines = 0;
    term->disptop = 0;
    term->disptext = NULL;
    term->dispcursx = term->dispcursy = -1;
    term->tabs = NULL;
    deselect(term);
    term->rows = term->cols = -1;
    power_on(term, true);
    term->beephead = term->beeptail = NULL;
    term->nbeeps = 0;
    term->lastbeep = false;
    term->beep_overloaded = false;
    term->attr_mask = 0xffffffff;
    term->backend = NULL;
    term->in_term_out = false;
    term->ltemp = NULL;
    term->ltemp_size = 0;
    term->wcFrom = NULL;
    term->wcTo = NULL;
    term->wcFromTo_size = 0;

    term->window_update_pending = false;
    term->window_update_cooldown = false;

    term->bidi_cache_size = 0;
    term->pre_bidi_cache = term->post_bidi_cache = NULL;

    /* FULL-TERMCHAR */
    term->basic_erase_char.chr = CSET_ASCII | ' ';
    term->basic_erase_char.attr = ATTR_DEFAULT;
    term->basic_erase_char.cc_next = 0;
    term->basic_erase_char.truecolour.fg = optionalrgb_none;
    term->basic_erase_char.truecolour.bg = optionalrgb_none;
    term->erase_char = term->basic_erase_char;

    term->last_selected_text = NULL;
    term->last_selected_attr = NULL;
    term->last_selected_tc = NULL;
    term->last_selected_len = 0;
    /* TermWin implementations will typically extend these with
     * clipboard ids they know about */
    term->mouse_select_clipboards[0] = CLIP_LOCAL;
    term->n_mouse_select_clipboards = 1;
    term->mouse_paste_clipboard = CLIP_NULL;

    term->last_graphic_char = 0;

    term->trusted = true;

    term->bracketed_paste_active = false;

    term->window_title = dupstr("");
    term->icon_title = dupstr("");
    term->wintitle_codepage = term->icontitle_codepage = DEFAULT_CODEPAGE;
    term->minimised = false;
    term->winpos_x = term->winpos_y = 0;
    term->winpixsize_x = term->winpixsize_y = 0;

    term->win_move_pending = false;
    term->win_resize_pending = WIN_RESIZE_NO;
    term->win_zorder_pending = false;
    term->win_minimise_pending = false;
    term->win_maximise_pending = false;
    term->win_title_pending = false;
    term->win_icon_title_pending = false;
    term->win_pointer_shape_pending = false;
    term->win_refresh_pending = false;
    term->win_scrollbar_update_pending = false;
    term->win_palette_pending = false;

    term->bidi_ctx = bidi_new_context();

    palette_reset(term, false);

    return term;
}